

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_tree.hh
# Opt level: O2

void __thiscall
kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::~tree
          (tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_> *this)

{
  clear(this);
  htmlcxx2::HTML::Node::~Node(&this->head->data);
  htmlcxx2::HTML::Node::~Node(&this->feet->data);
  operator_delete(this->head,0xd8);
  operator_delete(this->feet,0xd8);
  return;
}

Assistant:

tree<T, tree_node_allocator>::~tree()
    {
    clear();
    alloc_.destroy(head);
    alloc_.destroy(feet);
    alloc_.deallocate(head,1);
    alloc_.deallocate(feet,1);
    }